

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O2

void __thiscall CurrentGenerator::CurrentGenerator(CurrentGenerator *this)

{
  double dVar1;
  CurrentGenerator_param *pCVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  ulong uVar5;
  int iVar6;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00134a80;
  pCVar2 = (CurrentGenerator_param *)operator_new(0x28);
  pCVar2->I = 10.0;
  pCVar2->noiseMean = 0.0;
  pCVar2->noiseStd = 1.0;
  pCVar2->noiseOn = 0.0;
  pCVar2->ac_hz = 0.0;
  this->param = pCVar2;
  (this->generator)._M_x = 1;
  *(undefined4 *)&(this->distribution)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->distribution)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  pCVar3 = Clock::getInstance();
  this->clock = pCVar3;
  pLVar4 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar4;
  uVar5 = std::chrono::_V2::system_clock::now();
  iVar6 = (int)((uVar5 & 0xffffffff) % 0x7fffffff);
  (this->generator)._M_x = (ulong)(iVar6 + (uint)(iVar6 == 0));
  dVar1 = this->param->noiseStd;
  (this->distribution)._M_param._M_mean = this->param->noiseMean;
  (this->distribution)._M_param._M_stddev = dVar1;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  return;
}

Assistant:

CurrentGenerator::CurrentGenerator() : param(new CurrentGenerator_param) { 
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(seed);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}